

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IF97.h
# Opt level: O1

void __thiscall IF97::Region3::Region3(Region3 *this)

{
  iterator iVar1;
  iterator iVar2;
  int *piVar3;
  long lVar4;
  ulong uVar5;
  
  memset(this,0,0x138);
  this->T_star = 1000.0;
  this->p_star = 1.0;
  if (DAT_0012bc10 != reg3rdata) {
    lVar4 = 8;
    uVar5 = 0;
    do {
      iVar1._M_current =
           (this->nr).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_finish;
      if (iVar1._M_current ==
          (this->nr).super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<double,std::allocator<double>>::_M_realloc_insert<double_const&>
                  ((vector<double,std::allocator<double>> *)&this->nr,iVar1,
                   (double *)(reg3rdata + lVar4));
      }
      else {
        *iVar1._M_current = *(double *)(reg3rdata + lVar4);
        (this->nr).super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_finish = iVar1._M_current + 1;
      }
      piVar3 = (int *)(reg3rdata + lVar4 + -8);
      iVar2._M_current =
           (this->Ir).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_finish;
      if (iVar2._M_current ==
          (this->Ir).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_end_of_storage) {
        std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                  ((vector<int,std::allocator<int>> *)this,iVar2,piVar3);
      }
      else {
        *iVar2._M_current = *piVar3;
        (this->Ir).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_finish = iVar2._M_current + 1;
      }
      piVar3 = (int *)(reg3rdata + lVar4 + -4);
      iVar2._M_current =
           (this->Jr).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_finish;
      if (iVar2._M_current ==
          (this->Jr).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_end_of_storage) {
        std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                  ((vector<int,std::allocator<int>> *)&this->Jr,iVar2,piVar3);
      }
      else {
        *iVar2._M_current = *piVar3;
        (this->Jr).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_finish = iVar2._M_current + 1;
      }
      uVar5 = uVar5 + 1;
      lVar4 = lVar4 + 0x10;
    } while (uVar5 < (ulong)(DAT_0012bc10 - reg3rdata >> 4));
  }
  if (DAT_0012bb38 != Hrdata) {
    lVar4 = 8;
    uVar5 = 0;
    do {
      iVar1._M_current =
           (this->munr).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_finish;
      if (iVar1._M_current ==
          (this->munr).super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<double,std::allocator<double>>::_M_realloc_insert<double_const&>
                  ((vector<double,std::allocator<double>> *)&this->munr,iVar1,
                   (double *)(Hrdata + lVar4));
      }
      else {
        *iVar1._M_current = *(double *)(Hrdata + lVar4);
        (this->munr).super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_finish = iVar1._M_current + 1;
      }
      piVar3 = (int *)(Hrdata + lVar4 + -8);
      iVar2._M_current =
           (this->muIr).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_finish;
      if (iVar2._M_current ==
          (this->muIr).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
          ._M_end_of_storage) {
        std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                  ((vector<int,std::allocator<int>> *)&this->muIr,iVar2,piVar3);
      }
      else {
        *iVar2._M_current = *piVar3;
        (this->muIr).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_finish = iVar2._M_current + 1;
      }
      piVar3 = (int *)(Hrdata + lVar4 + -4);
      iVar2._M_current =
           (this->muJr).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_finish;
      if (iVar2._M_current ==
          (this->muJr).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
          ._M_end_of_storage) {
        std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                  ((vector<int,std::allocator<int>> *)&this->muJr,iVar2,piVar3);
      }
      else {
        *iVar2._M_current = *piVar3;
        (this->muJr).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_finish = iVar2._M_current + 1;
      }
      uVar5 = uVar5 + 1;
      lVar4 = lVar4 + 0x10;
    } while (uVar5 < (ulong)(DAT_0012bb38 - Hrdata >> 4));
  }
  if (DAT_0012bb50 != H0data) {
    lVar4 = 8;
    uVar5 = 0;
    do {
      iVar1._M_current =
           (this->mun0).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_finish;
      if (iVar1._M_current ==
          (this->mun0).super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<double,std::allocator<double>>::_M_realloc_insert<double_const&>
                  ((vector<double,std::allocator<double>> *)&this->mun0,iVar1,
                   (double *)(H0data + lVar4));
      }
      else {
        *iVar1._M_current = *(double *)(H0data + lVar4);
        (this->mun0).super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_finish = iVar1._M_current + 1;
      }
      piVar3 = (int *)(H0data + lVar4 + -8);
      iVar2._M_current =
           (this->muJ0).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_finish;
      if (iVar2._M_current ==
          (this->muJ0).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
          ._M_end_of_storage) {
        std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                  ((vector<int,std::allocator<int>> *)&this->muJ0,iVar2,piVar3);
      }
      else {
        *iVar2._M_current = *piVar3;
        (this->muJ0).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_finish = iVar2._M_current + 1;
      }
      uVar5 = uVar5 + 1;
      lVar4 = lVar4 + 0x10;
    } while (uVar5 < (ulong)(DAT_0012bb50 - H0data >> 4));
  }
  if (DAT_0012bb68 != Lrdata) {
    lVar4 = 8;
    uVar5 = 0;
    do {
      iVar1._M_current =
           (this->lamnr).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_finish;
      if (iVar1._M_current ==
          (this->lamnr).super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<double,std::allocator<double>>::_M_realloc_insert<double_const&>
                  ((vector<double,std::allocator<double>> *)&this->lamnr,iVar1,
                   (double *)(Lrdata + lVar4));
      }
      else {
        *iVar1._M_current = *(double *)(Lrdata + lVar4);
        (this->lamnr).super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_finish = iVar1._M_current + 1;
      }
      piVar3 = (int *)(Lrdata + lVar4 + -8);
      iVar2._M_current =
           (this->lamIr).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_finish;
      if (iVar2._M_current ==
          (this->lamIr).super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                  ((vector<int,std::allocator<int>> *)&this->lamIr,iVar2,piVar3);
      }
      else {
        *iVar2._M_current = *piVar3;
        (this->lamIr).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_finish = iVar2._M_current + 1;
      }
      piVar3 = (int *)(Lrdata + lVar4 + -4);
      iVar2._M_current =
           (this->lamJr).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_finish;
      if (iVar2._M_current ==
          (this->lamJr).super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                  ((vector<int,std::allocator<int>> *)&this->lamJr,iVar2,piVar3);
      }
      else {
        *iVar2._M_current = *piVar3;
        (this->lamJr).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_finish = iVar2._M_current + 1;
      }
      uVar5 = uVar5 + 1;
      lVar4 = lVar4 + 0x10;
    } while (uVar5 < (ulong)(DAT_0012bb68 - Lrdata >> 4));
  }
  if (DAT_0012bb80 != L0data) {
    lVar4 = 8;
    uVar5 = 0;
    do {
      iVar1._M_current =
           (this->lamn0).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_finish;
      if (iVar1._M_current ==
          (this->lamn0).super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<double,std::allocator<double>>::_M_realloc_insert<double_const&>
                  ((vector<double,std::allocator<double>> *)&this->lamn0,iVar1,
                   (double *)(L0data + lVar4));
      }
      else {
        *iVar1._M_current = *(double *)(L0data + lVar4);
        (this->lamn0).super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_finish = iVar1._M_current + 1;
      }
      piVar3 = (int *)(L0data + lVar4 + -8);
      iVar2._M_current =
           (this->lamJ0).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_finish;
      if (iVar2._M_current ==
          (this->lamJ0).super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                  ((vector<int,std::allocator<int>> *)&this->lamJ0,iVar2,piVar3);
      }
      else {
        *iVar2._M_current = *piVar3;
        (this->lamJ0).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_finish = iVar2._M_current + 1;
      }
      uVar5 = uVar5 + 1;
      lVar4 = lVar4 + 0x10;
    } while (uVar5 < (ulong)(DAT_0012bb80 - L0data >> 4));
  }
  this->R = 0.461526;
  return;
}

Assistant:

Region3() : T_star(1000), p_star(1*p_fact) {
            for (std::size_t i = 0; i < reg3rdata.size(); ++i){
                nr.push_back(reg3rdata[i].n);
                Ir.push_back(reg3rdata[i].I);
                Jr.push_back(reg3rdata[i].J);
            }
            for (std::size_t i = 0; i < Hrdata.size(); ++i){
                munr.push_back(Hrdata[i].n);
                muIr.push_back(Hrdata[i].I);
                muJr.push_back(Hrdata[i].J);
            }
            for (std::size_t i = 0; i < H0data.size(); ++i){
                mun0.push_back(H0data[i].n);
                muJ0.push_back(H0data[i].J);
            }
            for (std::size_t i = 0; i < Lrdata.size(); ++i){
                lamnr.push_back(Lrdata[i].n);
                lamIr.push_back(Lrdata[i].I);
                lamJr.push_back(Lrdata[i].J);
            }
            for (std::size_t i = 0; i < L0data.size(); ++i){
                lamn0.push_back(L0data[i].n);
                lamJ0.push_back(L0data[i].J);
            }
            R = Rgas;
        }